

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O1

void __thiscall
kratos::Var::Var(Var *this,Generator *m,string *name,uint32_t var_width,
                vector<unsigned_int,_std::allocator<unsigned_int>_> *size,bool is_signed,
                VarType type)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  string *psVar3;
  bool bVar4;
  UserException *pUVar5;
  undefined7 in_register_00000089;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar6;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  pointer local_88;
  size_type sStack_80;
  string *local_78;
  string local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  uint32_t local_40;
  string *local_38;
  
  aVar6._1_7_ = in_register_00000089;
  aVar6._0_1_ = is_signed;
  (this->super_enable_shared_from_this<kratos::Var>)._M_weak_this.
  super___weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<kratos::Var>)._M_weak_this.
  super___weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_IRNode).fn_name_ln.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_IRNode).fn_name_ln.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->super_IRNode).fn_name_ln.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->super_IRNode).fn_name_ln.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->super_IRNode).comment._M_dataplus._M_p = (pointer)&(this->super_IRNode).comment.field_2;
  (this->super_IRNode).comment._M_string_length = 0;
  (this->super_IRNode).comment.field_2._M_local_buf[0] = '\0';
  (this->super_IRNode).ast_node_type_ = VarKind;
  (this->super_IRNode).attributes_.
  super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_IRNode).attributes_.
  super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_IRNode).attributes_.
  super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_IRNode)._vptr_IRNode = (_func_int **)&PTR_accept_002a7a60;
  local_78 = &this->name;
  local_48 = &(this->name).field_2;
  (this->name)._M_dataplus._M_p = (pointer)local_48;
  pcVar2 = (name->_M_dataplus)._M_p;
  local_38 = name;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_78,pcVar2,pcVar2 + name->_M_string_length);
  psVar3 = local_38;
  this->var_width_ = var_width;
  (this->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (size->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_start;
  (this->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (size->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  (this->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (size->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (size->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (size->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (size->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->size_param_)._M_h._M_buckets = &(this->size_param_)._M_h._M_single_bucket;
  (this->size_param_)._M_h._M_bucket_count = 1;
  (this->size_param_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->size_param_)._M_h._M_element_count = 0;
  (this->size_param_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->size_param_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->size_param_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->is_signed_ = is_signed;
  (this->sinks_)._M_h._M_buckets = &(this->sinks_)._M_h._M_single_bucket;
  (this->sinks_)._M_h._M_bucket_count = 1;
  (this->sinks_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->sinks_)._M_h._M_element_count = 0;
  (this->sinks_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->sinks_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->sinks_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->sources_)._M_h._M_buckets = &(this->sources_)._M_h._M_single_bucket;
  (this->sources_)._M_h._M_bucket_count = 1;
  (this->sources_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->sources_)._M_h._M_element_count = 0;
  (this->sources_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->sources_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->sources_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->type_ = type;
  (this->concat_vars_).
  super__Vector_base<std::shared_ptr<kratos::VarConcat>,_std::allocator<std::shared_ptr<kratos::VarConcat>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->concat_vars_).
  super__Vector_base<std::shared_ptr<kratos::VarConcat>,_std::allocator<std::shared_ptr<kratos::VarConcat>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->concat_vars_).
  super__Vector_base<std::shared_ptr<kratos::VarConcat>,_std::allocator<std::shared_ptr<kratos::VarConcat>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->slices_).
  super__Vector_base<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->slices_).
  super__Vector_base<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->slices_).
  super__Vector_base<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->before_var_str_)._M_dataplus._M_p = (pointer)&(this->before_var_str_).field_2;
  (this->before_var_str_)._M_string_length = 0;
  (this->before_var_str_).field_2._M_local_buf[0] = '\0';
  (this->after_var_str_)._M_dataplus._M_p = (pointer)&(this->after_var_str_).field_2;
  (this->after_var_str_)._M_string_length = 0;
  (this->after_var_str_).field_2._M_local_buf[0] = '\0';
  this->explicit_array_ = false;
  this->width_param_ = (Var *)0x0;
  this->raw_type_param_ = (Param *)0x0;
  this->is_packed_ = true;
  this->generator_ = m;
  p_Var1 = &(this->casted_)._M_t._M_impl.super__Rb_tree_header;
  (this->casted_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->casted_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->casted_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->casted_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->casted_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->extended_)._M_h._M_buckets = &(this->extended_)._M_h._M_single_bucket;
  (this->extended_)._M_h._M_bucket_count = 1;
  (this->extended_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->extended_)._M_h._M_element_count = 0;
  (this->extended_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->extended_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->extended_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_40 = var_width;
  if ((type & ~PortIO) != ConstValue && m == (Generator *)0x0) {
    pUVar5 = (UserException *)__cxa_allocate_exception(0x10);
    local_88 = (local_38->_M_dataplus)._M_p;
    sStack_80 = local_38->_M_string_length;
    format_str.size_ = 0xd;
    format_str.data_ = (char *)0x16;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = aVar6.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)&local_88;
    fmt::v7::detail::vformat_abi_cxx11_
              (&local_68,(detail *)"module is null for {0}",format_str,args);
    UserException::UserException(pUVar5,&local_68);
    __cxa_throw(pUVar5,&UserException::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar4 = is_valid_variable_name(local_38);
  if (bVar4) {
    if (local_40 != 0) {
      return;
    }
    pUVar5 = (UserException *)__cxa_allocate_exception(0x10);
    local_88 = (psVar3->_M_dataplus)._M_p;
    sStack_80 = psVar3->_M_string_length;
    format_str_01.size_ = 0xd;
    format_str_01.data_ = (char *)0x1f;
    args_01.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = aVar6.values_;
    args_01.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)&local_88;
    fmt::v7::detail::vformat_abi_cxx11_
              (&local_68,(detail *)"variable {0} cannot have size 0",format_str_01,args_01);
    UserException::UserException(pUVar5,&local_68);
    __cxa_throw(pUVar5,&UserException::typeinfo,std::runtime_error::~runtime_error);
  }
  pUVar5 = (UserException *)__cxa_allocate_exception(0x10);
  local_88 = (psVar3->_M_dataplus)._M_p;
  sStack_80 = psVar3->_M_string_length;
  format_str_00.size_ = 0xd;
  format_str_00.data_ = (char *)0x1e;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ = aVar6.values_;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_88;
  fmt::v7::detail::vformat_abi_cxx11_
            (&local_68,(detail *)"{0} is a SystemVerilog keyword",format_str_00,args_00);
  UserException::UserException(pUVar5,&local_68);
  __cxa_throw(pUVar5,&UserException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Var::Var(kratos::Generator *m, const std::string &name, uint32_t var_width,
         std::vector<uint32_t> size, bool is_signed, kratos::VarType type)
    : IRNode(IRNodeKind::VarKind),
      name(name),
      var_width_(var_width),
      size_(std::move(size)),
      is_signed_(is_signed),
      type_(type),
      generator_(m) {
    // only constant allows to be null generator
    if (m == nullptr && type != VarType::ConstValue && type != VarType::Iter)
        throw UserException(::format("module is null for {0}", name));
    if (!is_valid_variable_name(name))
        throw UserException(::format("{0} is a SystemVerilog keyword", name));
    if (var_width == 0) throw UserException(::format("variable {0} cannot have size 0", name));
}